

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O3

void rec_isnext(jit_State *J,BCReg ra)

{
  uint uVar1;
  TValue *pTVar2;
  TRef TVar3;
  TRef TVar4;
  TRef *pTVar5;
  
  pTVar2 = J->L->base;
  uVar1 = ra - 3;
  if ((((pTVar2[uVar1].field_4.it >> 0xf == 0x1fff7) &&
       (*(char *)(((ulong)pTVar2[uVar1].field_4 & 0x7fffffffffff) + 10) == '\x04')) &&
      ((pTVar2[(ulong)uVar1 + 1].u64 & 0xffff800000000000) == 0xfffa000000000000)) &&
     (pTVar2[(ulong)uVar1 + 2].u64 == 0xffffffffffffffff)) {
    TVar3 = J->base[uVar1];
    if (TVar3 == 0) {
      TVar3 = sload(J,uVar1);
    }
    (J->fold).ins.field_0.op1 = (IRRef1)TVar3;
    *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x45100003;
    TVar3 = lj_opt_fold(J);
    TVar4 = lj_ir_kint(J,4);
    (J->fold).ins.field_0.ot = 0x893;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar3;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar4;
    lj_opt_fold(J);
    pTVar5 = J->base;
    if (pTVar5[ra - 2] == 0) {
      sload(J,ra - 2);
      pTVar5 = J->base;
    }
    uVar1 = ra - 1;
    if (pTVar5[uVar1] == 0) {
      sload(J,uVar1);
    }
    TVar3 = lj_ir_kint(J,0);
    J->base[uVar1] = TVar3 | 0x100000;
    J->maxslot = ra;
    return;
  }
  lj_trace_err(J,LJ_TRERR_RECERR);
}

Assistant:

static void rec_isnext(jit_State *J, BCReg ra)
{
  cTValue *b = &J->L->base[ra-3];
  if (tvisfunc(b) && funcV(b)->c.ffid == FF_next &&
      tvistab(b+1) && tvisnil(b+2)) {
    /* These checks are folded away for a compiled pairs(). */
    TRef func = getslot(J, ra-3);
    TRef trid = emitir(IRT(IR_FLOAD, IRT_U8), func, IRFL_FUNC_FFID);
    emitir(IRTGI(IR_EQ), trid, lj_ir_kint(J, FF_next));
    (void)getslot(J, ra-2); /* Type check for table. */
    (void)getslot(J, ra-1); /* Type check for nil key. */
    J->base[ra-1] = lj_ir_kint(J, 0) | TREF_KEYINDEX;
    J->maxslot = ra;
  } else {  /* Abort trace. Interpreter will despecialize bytecode. */
    lj_trace_err(J, LJ_TRERR_RECERR);
  }
}